

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# row_common.cc
# Opt level: O3

void SobelXRow_C(uint8_t *src_y0,uint8_t *src_y1,uint8_t *src_y2,uint8_t *dst_sobelx,int width)

{
  uint uVar1;
  ulong uVar2;
  uint8_t uVar3;
  uint uVar4;
  
  if (0 < width) {
    uVar2 = 0;
    do {
      uVar1 = (((uint)src_y2[uVar2] + (uint)src_y0[uVar2]) -
              ((uint)src_y2[uVar2 + 2] + (uint)src_y0[uVar2 + 2])) +
              ((uint)src_y1[uVar2] - (uint)src_y1[uVar2 + 2]) * 2;
      uVar4 = -uVar1;
      if (0 < (int)uVar1) {
        uVar4 = uVar1;
      }
      uVar3 = (uint8_t)uVar4;
      if (0xfe < uVar4) {
        uVar3 = 0xff;
      }
      dst_sobelx[uVar2] = uVar3;
      uVar2 = uVar2 + 1;
    } while ((uint)width != uVar2);
  }
  return;
}

Assistant:

void SobelXRow_C(const uint8_t* src_y0,
                 const uint8_t* src_y1,
                 const uint8_t* src_y2,
                 uint8_t* dst_sobelx,
                 int width) {
  int i;
  for (i = 0; i < width; ++i) {
    int a = src_y0[i];
    int b = src_y1[i];
    int c = src_y2[i];
    int a_sub = src_y0[i + 2];
    int b_sub = src_y1[i + 2];
    int c_sub = src_y2[i + 2];
    int a_diff = a - a_sub;
    int b_diff = b - b_sub;
    int c_diff = c - c_sub;
    int sobel = Abs(a_diff + b_diff * 2 + c_diff);
    dst_sobelx[i] = (uint8_t)(clamp255(sobel));
  }
}